

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O2

uint8_t get_last_nonzero_byte(uint8_t *data,size_t sz)

{
  long lVar1;
  size_t i;
  
  do {
    if (sz == 0) {
      return '\0';
    }
    lVar1 = sz - 1;
    sz = sz - 1;
  } while (data[lVar1] == '\0');
  return data[lVar1];
}

Assistant:

static uint8_t get_last_nonzero_byte(const uint8_t *data, size_t sz) {
  // Scan backward and return on the first nonzero byte.
  size_t i = sz;
  while (i != 0) {
    --i;
    if (data[i] != 0) return data[i];
  }
  return 0;
}